

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.cpp
# Opt level: O1

bool __thiscall FIX::Dictionary::getBool(Dictionary *this,string *key)

{
  bool bVar1;
  string local_a8 [4];
  
  getString(local_a8,this,key,false);
  bVar1 = BoolConvertor::convert(local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8[0]._M_dataplus._M_p != &local_a8[0].field_2) {
    operator_delete(local_a8[0]._M_dataplus._M_p,local_a8[0].field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

bool Dictionary::getBool( const std::string& key ) const
EXCEPT ( ConfigError, FieldConvertError )
{
  try
  {
    return BoolConvertor::convert( getString(key) );
  }
  catch ( FieldConvertError& )
  {
    throw ConfigError( "Illegal value " + getString(key) + " for " + key );
  }
}